

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSOSerializer.cpp
# Opt level: O3

bool Diligent::PRSSerializer<(Diligent::SerializerMode)1>::SerializeDesc
               (Serializer<(Diligent::SerializerMode)1> *Ser,
               ConstQual<PipelineResourceSignatureDesc> *Desc,DynamicLinearAllocator *Allocator)

{
  bool bVar1;
  
  bVar1 = Serializer<(Diligent::SerializerMode)1>::Copy<unsigned_char_const>
                    (Ser,&Desc->BindingIndex,1);
  if (bVar1) {
    bVar1 = Serializer<(Diligent::SerializerMode)1>::operator()
                      (Ser,&Desc->UseCombinedTextureSamplers,&Desc->CombinedSamplerSuffix);
    if (bVar1) {
      bVar1 = Serializer<(Diligent::SerializerMode)1>::
              SerializeArray<Diligent::PipelineResourceDesc_const*const,unsigned_int_const,Diligent::PRSSerializer<(Diligent::SerializerMode)1>::SerializeDesc(Diligent::Serializer<(Diligent::SerializerMode)1>&,Diligent::PipelineResourceSignatureDesc_const&,Diligent::DynamicLinearAllocator*)::_lambda(Diligent::Serializer<(Diligent::SerializerMode)1>&,Diligent::PipelineResourceDesc_const&)_1_>
                        (Ser,Allocator,&Desc->Resources,&Desc->NumResources);
      if (bVar1) {
        bVar1 = Serializer<(Diligent::SerializerMode)1>::
                SerializeArray<Diligent::ImmutableSamplerDesc_const*const,unsigned_int_const,bool(*)(Diligent::Serializer<(Diligent::SerializerMode)1>&,Diligent::ImmutableSamplerDesc_const&)>
                          (Ser,Allocator,&Desc->ImmutableSamplers,&Desc->NumImmutableSamplers,
                           SerializeImmutableSampler<(Diligent::SerializerMode)1>);
        return bVar1;
      }
    }
  }
  return false;
}

Assistant:

bool PRSSerializer<Mode>::SerializeDesc(
    Serializer<Mode>&                         Ser,
    ConstQual<PipelineResourceSignatureDesc>& Desc,
    DynamicLinearAllocator*                   Allocator)
{
    // Serialize PipelineResourceSignatureDesc
    if (!Ser(Desc.BindingIndex,
             Desc.UseCombinedTextureSamplers,
             Desc.CombinedSamplerSuffix))
        return false;
    // skip Name
    // skip SRBAllocationGranularity

    if (!Ser.SerializeArray(Allocator, Desc.Resources, Desc.NumResources,
                            [](Serializer<Mode>&                Ser,
                               ConstQual<PipelineResourceDesc>& ResDesc) //
                            {
                                return Ser(ResDesc.Name,
                                           ResDesc.ShaderStages,
                                           ResDesc.ArraySize,
                                           ResDesc.ResourceType,
                                           ResDesc.VarType,
                                           ResDesc.Flags,
                                           ResDesc.WebGPUAttribs.BindingType,
                                           ResDesc.WebGPUAttribs.TextureViewDim,
                                           ResDesc.WebGPUAttribs.UAVTextureFormat);
                            }))
        return false;

    return Ser.SerializeArray(Allocator, Desc.ImmutableSamplers, Desc.NumImmutableSamplers, SerializeImmutableSampler<Mode>);

    ASSERT_SIZEOF64(PipelineResourceSignatureDesc, 56, "Did you add a new member to PipelineResourceSignatureDesc? Please add serialization here.");
    ASSERT_SIZEOF64(PipelineResourceDesc, 24, "Did you add a new member to PipelineResourceDesc? Please add serialization here.");
}